

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

uint __thiscall llvm::APInt::countLeadingOnesSlowCase(APInt *this)

{
  uint uVar1;
  size_t sVar2;
  uint local_20;
  int local_1c;
  uint Count;
  int i;
  uint shift;
  uint highWordBits;
  APInt *this_local;
  
  i = this->BitWidth & 0x3f;
  if (i == 0) {
    i = 0x40;
    Count._0_1_ = 0;
  }
  else {
    Count._0_1_ = 0x40 - (char)i;
  }
  uVar1 = getNumWords(this);
  sVar2 = countLeadingOnes<unsigned_long>
                    ((this->U).pVal[(int)(uVar1 - 1)] << ((byte)Count & 0x3f),ZB_Width);
  local_20 = (uint)sVar2;
  if (local_20 == i) {
    for (local_1c = uVar1 - 2; -1 < local_1c; local_1c = local_1c + -1) {
      if ((this->U).pVal[local_1c] != 0xffffffffffffffff) {
        sVar2 = countLeadingOnes<unsigned_long>((this->U).pVal[local_1c],ZB_Width);
        return local_20 + (int)sVar2;
      }
      local_20 = local_20 + 0x40;
    }
  }
  return local_20;
}

Assistant:

unsigned APInt::countLeadingOnesSlowCase() const {
  unsigned highWordBits = BitWidth % APINT_BITS_PER_WORD;
  unsigned shift;
  if (!highWordBits) {
    highWordBits = APINT_BITS_PER_WORD;
    shift = 0;
  } else {
    shift = APINT_BITS_PER_WORD - highWordBits;
  }
  int i = getNumWords() - 1;
  unsigned Count = llvm::countLeadingOnes(U.pVal[i] << shift);
  if (Count == highWordBits) {
    for (i--; i >= 0; --i) {
      if (U.pVal[i] == WORD_MAX)
        Count += APINT_BITS_PER_WORD;
      else {
        Count += llvm::countLeadingOnes(U.pVal[i]);
        break;
      }
    }
  }
  return Count;
}